

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_pgroup_create(Integer *list,Integer count)

{
  int iVar1;
  Integer IVar2;
  void *__ptr;
  void *__ptr_00;
  int *piVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  ARMCI_Group *tmpgrp;
  int *tmp2_list;
  Integer *tmp_list;
  int tmp_count;
  Integer parent;
  Integer itmp;
  Integer nprocs;
  Integer j;
  Integer i;
  Integer pgrp_handle;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  bool bVar5;
  undefined1 uVar6;
  long local_28;
  long local_20;
  long local_18;
  
  __ptr = malloc(GAnproc << 3);
  __ptr_00 = malloc(GAnproc << 2);
  local_18 = -1;
  local_20 = 0;
  do {
    if (PGRP_LIST[local_20].actv == 0) {
      local_18 = local_20;
    }
    local_20 = local_20 + 1;
    uVar6 = local_20 < _max_global_array && local_18 == -1;
  } while ((bool)uVar6);
  if (local_18 == -1) {
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  IVar2 = GAnproc;
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    local_28 = local_20;
    if ((*(long *)(in_RDI + local_20 * 8) < 0) || (IVar2 <= *(long *)(in_RDI + local_20 * 8))) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    while (local_28 = local_28 + 1, local_28 < in_RSI) {
      if (*(long *)(in_RDI + local_20 * 8) == *(long *)(in_RDI + local_28 * 8)) {
        pnga_error(in_stack_00000140,in_stack_00000138);
      }
    }
  }
  piVar3 = (int *)malloc(GAnproc << 3);
  PGRP_LIST[local_18].map_proc_list = piVar3;
  PGRP_LIST[local_18].inv_map_proc_list = PGRP_LIST[local_18].map_proc_list + GAnproc;
  for (local_20 = 0; local_20 < GAnproc; local_20 = local_20 + 1) {
    PGRP_LIST[local_18].map_proc_list[local_20] = -1;
  }
  for (local_20 = 0; local_20 < GAnproc; local_20 = local_20 + 1) {
    PGRP_LIST[local_18].inv_map_proc_list[local_20] = -1;
  }
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    *(int *)((long)__ptr_00 + local_20 * 4) = (int)*(undefined8 *)(in_RDI + local_20 * 8);
  }
  for (local_28 = 1; local_28 < in_RSI; local_28 = local_28 + 1) {
    iVar1 = *(int *)((long)__ptr_00 + local_28 * 4);
    local_20 = local_28;
    while( true ) {
      local_20 = local_20 + -1;
      bVar5 = false;
      if (-1 < local_20) {
        bVar5 = iVar1 < *(int *)((long)__ptr_00 + local_20 * 4);
      }
      if (!bVar5) break;
      *(undefined4 *)((long)__ptr_00 + local_20 * 4 + 4) =
           *(undefined4 *)((long)__ptr_00 + local_20 * 4);
    }
    *(int *)((long)__ptr_00 + local_20 * 4 + 4) = iVar1;
    in_stack_ffffffffffffff9e = 0;
  }
  if (GA_Default_Proc_Group == -1) {
    for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
      *(long *)((long)__ptr + local_20 * 8) = (long)*(int *)((long)__ptr_00 + local_20 * 4);
    }
  }
  else {
    lVar4 = (long)GA_Default_Proc_Group;
    for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
      *(long *)((long)__ptr + local_20 * 8) =
           (long)PGRP_LIST[lVar4].inv_map_proc_list[*(int *)((long)__ptr_00 + local_20 * 4)];
    }
  }
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    lVar4 = *(long *)((long)__ptr + local_20 * 8);
    PGRP_LIST[local_18].map_proc_list[lVar4] = (int)local_20;
    PGRP_LIST[local_18].inv_map_proc_list[local_20] = (int)lVar4;
  }
  PGRP_LIST[local_18].actv = 1;
  PGRP_LIST[local_18].parent = GA_Default_Proc_Group;
  PGRP_LIST[local_18].mirrored = 0;
  PGRP_LIST[local_18].map_nproc = (int)in_RSI;
  ARMCI_Group_create((int)((ulong)&PGRP_LIST[local_18].group >> 0x20),
                     (int *)CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff9e,
                                                    in_stack_ffffffffffffff98)),
                     (ARMCI_Group *)0x1b9ecf);
  free(__ptr);
  free(__ptr_00);
  return local_18;
}

Assistant:

Integer pnga_pgroup_create(Integer *list, Integer count)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    Integer parent;
    int tmp_count;
    Integer *tmp_list;
    int *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
 

    /* Allocate temporary arrays */
    tmp_list = (Integer*)malloc(GAnproc*sizeof(Integer));
    tmp2_list = (int*)malloc(GAnproc*sizeof(int));

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Check list for validity (no duplicates and no out of range entries) */
    nprocs = GAnproc;
    for (i=0; i<count; i++) {
       if (list[i] <0 || list[i] >= nprocs)
	  pnga_error(" invalid element in list ", list[i]);
       for (j=i+1; j<count; j++) {
	  if (list[i] == list[j])
	     pnga_error(" Duplicate elements in list ", list[i]);
       }
    }
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    
    for (i=0; i<count; i++) {
       tmp2_list[i] = (int)list[i];
    }
    
    /* use a simple sort routine to reorder list into assending order */
    for (j=1; j<count; j++) {
       itmp = tmp2_list[j];
       i = j-1;
       while(i>=0  && tmp2_list[i] > itmp) {
          tmp2_list[i+1] = tmp2_list[i];
          i--;
       }
       tmp2_list[i+1] = itmp;
    }
    
    /* Remap elements in list to absolute processor indices (if necessary)*/
    if (GA_Default_Proc_Group != -1) {
       parent = GA_Default_Proc_Group;
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].inv_map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)tmp2_list[i];
       }
    }
    
    tmp_count = (int)(count);
    /* Create proc list maps */
    for (i=0; i<count; i++) {
       j = tmp_list[i];
       PGRP_LIST[pgrp_handle].map_proc_list[j] = i;
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = j;
    }
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = GA_Default_Proc_Group;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp2_list, &PGRP_LIST[pgrp_handle].group);
#endif

    /* Clean up temporary arrays */
    free(tmp_list);
    free(tmp2_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}